

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

bool isAudioStreamType(StreamType stream_coding_type)

{
  bool local_9;
  StreamType stream_coding_type_local;
  
  if ((((stream_coding_type - AUDIO_MPEG1 < 2) || (stream_coding_type == AUDIO_AAC)) ||
      (stream_coding_type == AUDIO_AAC_RAW)) ||
     ((stream_coding_type - AUDIO_LPCM < 8 ||
      (stream_coding_type == AUDIO_EAC3_SECONDARY || stream_coding_type == AUDIO_DTS_HD_SECONDARY)))
     ) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool isAudioStreamType(const StreamType stream_coding_type)
{
    switch (stream_coding_type)
    {
    case StreamType::AUDIO_LPCM:
    case StreamType::AUDIO_AC3:
    case StreamType::AUDIO_DTS:
    case StreamType::AUDIO_TRUE_HD:
    case StreamType::AUDIO_EAC3:
    case StreamType::AUDIO_EAC3_ATSC:
    case StreamType::AUDIO_DTS_HD:
    case StreamType::AUDIO_DTS_HD_MA:
    case StreamType::AUDIO_EAC3_SECONDARY:
    case StreamType::AUDIO_DTS_HD_SECONDARY:
    case StreamType::AUDIO_AAC:
    case StreamType::AUDIO_AAC_RAW:
    case StreamType::AUDIO_MPEG1:
    case StreamType::AUDIO_MPEG2:
        return true;
    default:
        return false;
    }
}